

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flt2vrml.c
# Opt level: O2

void mult_matrix_vec(float *m,float *v)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  float fVar5;
  
  fVar1 = *v;
  fVar2 = v[1];
  fVar3 = v[2];
  fVar5 = m[0xe] * fVar3 + m[0xc] * fVar1 + m[0xd] * fVar2 + m[0xf];
  uVar4 = -(uint)(1.1920929e-07 < ABS(fVar5));
  fVar5 = (float)(~uVar4 & 0x3f800000 | (uint)(1.0 / fVar5) & uVar4);
  *v = (m[2] * fVar3 + *m * fVar1 + m[1] * fVar2 + m[3]) * fVar5;
  v[1] = (m[6] * fVar3 + m[4] * fVar1 + m[5] * fVar2 + m[7]) * fVar5;
  v[2] = (fVar3 * m[10] + fVar1 * m[8] + fVar2 * m[9] + m[0xb]) * fVar5;
  return;
}

Assistant:

static void
mult_matrix_vec(float *m, float *v)
{
  float W;
  float src[3];
  float (*matrix)[4];

  matrix = (float (*)[4]) m;

  src[0] = v[0];
  src[1] = v[1];
  src[2] = v[2];

  W =
    src[0]*matrix[3][0]+
    src[1]*matrix[3][1]+
    src[2]*matrix[3][2]+
    matrix[3][3];

  if (fabs(W) > FLT_EPSILON) W = 1.0f / W;
  else W = 1.0f;

  v[0] =
    (src[0]*matrix[0][0]+
     src[1]*matrix[0][1]+
     src[2]*matrix[0][2]+
     matrix[0][3])*W;
  v[1] =
    (src[0]*matrix[1][0]+
     src[1]*matrix[1][1]+
     src[2]*matrix[1][2]+
     matrix[1][3])*W;
  v[2] =
    (src[0]*matrix[2][0]+
     src[1]*matrix[2][1]+
     src[2]*matrix[2][2]+
     matrix[2][3])*W;
}